

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::set_user_ctx(raft_server *this,string *ctx)

{
  int iVar1;
  element_type *this_00;
  element_type *peVar2;
  undefined4 extraout_var;
  unsigned_long *args_3;
  raft_server *in_RDI;
  ptr<log_entry> entry;
  ptr<buffer> new_conf_buf;
  ptr<cluster_config> cloned_config;
  ptr<buffer> enc_conf;
  ptr<cluster_config> c_conf;
  string *in_stack_ffffffffffffff48;
  cluster_config *in_stack_ffffffffffffff50;
  raft_server *in_stack_ffffffffffffff90;
  ptr<log_entry> *in_stack_ffffffffffffff98;
  raft_server *in_stack_ffffffffffffffa0;
  cluster_config *in_stack_ffffffffffffffe8;
  shared_ptr<nuraft::buffer> *args_1;
  
  get_config(in_RDI);
  std::__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x252350);
  cluster_config::serialize(in_stack_ffffffffffffffe8);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffff50);
  cluster_config::deserialize((buffer *)in_RDI);
  this_00 = std::
            __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x252388);
  peVar2 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x25239e);
  iVar1 = (*peVar2->_vptr_log_store[2])();
  args_1 = (shared_ptr<nuraft::buffer> *)CONCAT44(extraout_var,iVar1);
  cluster_config::set_log_idx(this_00,(ulong)args_1);
  std::__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x2523cc);
  cluster_config::set_user_ctx(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x2523e8);
  cluster_config::serialize(in_stack_ffffffffffffffe8);
  std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x252408);
  args_3 = (unsigned_long *)srv_state::get_term((srv_state *)0x252410);
  timer_helper::get_timeofday_us();
  cs_new<nuraft::log_entry,unsigned_long,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type,unsigned_long>
            ((unsigned_long *)in_RDI,args_1,(log_val_type *)this_00,args_3);
  store_log_entry(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                  (ulong)in_stack_ffffffffffffff90);
  request_append_entries(in_stack_ffffffffffffff90);
  std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x252485);
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x25248f);
  std::shared_ptr<nuraft::cluster_config>::~shared_ptr
            ((shared_ptr<nuraft::cluster_config> *)0x252499);
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x2524a6);
  std::shared_ptr<nuraft::cluster_config>::~shared_ptr
            ((shared_ptr<nuraft::cluster_config> *)0x2524b3);
  return;
}

Assistant:

void raft_server::set_user_ctx(const std::string& ctx) {
    // Clone current cluster config.
    ptr<cluster_config> c_conf = get_config();
    ptr<buffer> enc_conf = c_conf->serialize();
    ptr<cluster_config> cloned_config = cluster_config::deserialize(*enc_conf);

    // Create a log for new configuration, it should be replicated.
    cloned_config->set_log_idx(log_store_->next_slot());
    cloned_config->set_user_ctx(ctx);

    ptr<buffer> new_conf_buf = cloned_config->serialize();
    ptr<log_entry> entry = cs_new<log_entry>
                           ( state_->get_term(),
                             new_conf_buf,
                             log_val_type::conf,
                             timer_helper::get_timeofday_us() );
    store_log_entry(entry);
    request_append_entries();
}